

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O3

int WriteData(char *filename,WebPData *webpdata)

{
  FILE *__s;
  size_t sVar1;
  uint uVar2;
  
  if ((*filename == '-') && (filename[1] == '\0')) {
    __s = (FILE *)ImgIoUtilSetBinaryMode((FILE *)_stdout);
  }
  else {
    __s = fopen(filename,"wb");
  }
  if (__s == (FILE *)0x0) {
    uVar2 = 0;
    fprintf(_stderr,"Error opening output WebP file %s!\n",filename);
  }
  else {
    sVar1 = fwrite(webpdata->bytes,webpdata->size,1,__s);
    if (sVar1 != 1) {
      fprintf(_stderr,"Error writing file %s!\n",filename);
    }
    else {
      fprintf(_stderr,"Saved file %s (%d bytes)\n",filename,(ulong)(uint)webpdata->size);
    }
    uVar2 = (uint)(sVar1 == 1);
    if (__s != _stdout) {
      fclose(__s);
    }
  }
  return uVar2;
}

Assistant:

static int WriteData(const char* filename, const WebPData* const webpdata) {
  int ok = 0;
  FILE* fout = WSTRCMP(filename, "-") ? WFOPEN(filename, "wb")
                                      : ImgIoUtilSetBinaryMode(stdout);
  if (fout == NULL) {
    WFPRINTF(stderr, "Error opening output WebP file %s!\n",
             (const W_CHAR*)filename);
    return 0;
  }
  if (fwrite(webpdata->bytes, webpdata->size, 1, fout) != 1) {
    WFPRINTF(stderr, "Error writing file %s!\n", (const W_CHAR*)filename);
  } else {
    WFPRINTF(stderr, "Saved file %s (%d bytes)\n",
             (const W_CHAR*)filename, (int)webpdata->size);
    ok = 1;
  }
  if (fout != stdout) fclose(fout);
  return ok;
}